

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHash.h
# Opt level: O3

HighsHashTable<int,_int> * __thiscall
HighsHashTable<int,_int>::operator=
          (HighsHashTable<int,_int> *this,HighsHashTable<int,_int> *param_1)

{
  _Head_base<0UL,_HighsHashTableEntry<int,_int>_*,_false> _Var1;
  _Head_base<0UL,_HighsHashTableEntry<int,_int>_*,_false> _Var2;
  uchar *puVar3;
  uchar *puVar4;
  u64 uVar5;
  
  _Var1._M_head_impl =
       (param_1->entries)._M_t.
       super___uniq_ptr_impl<HighsHashTableEntry<int,_int>,_HighsHashTable<int,_int>::OpNewDeleter>.
       _M_t.
       super__Tuple_impl<0UL,_HighsHashTableEntry<int,_int>_*,_HighsHashTable<int,_int>::OpNewDeleter>
       .super__Head_base<0UL,_HighsHashTableEntry<int,_int>_*,_false>._M_head_impl;
  (param_1->entries)._M_t.
  super___uniq_ptr_impl<HighsHashTableEntry<int,_int>,_HighsHashTable<int,_int>::OpNewDeleter>._M_t.
  super__Tuple_impl<0UL,_HighsHashTableEntry<int,_int>_*,_HighsHashTable<int,_int>::OpNewDeleter>.
  super__Head_base<0UL,_HighsHashTableEntry<int,_int>_*,_false>._M_head_impl =
       (HighsHashTableEntry<int,_int> *)0x0;
  _Var2._M_head_impl =
       (this->entries)._M_t.
       super___uniq_ptr_impl<HighsHashTableEntry<int,_int>,_HighsHashTable<int,_int>::OpNewDeleter>.
       _M_t.
       super__Tuple_impl<0UL,_HighsHashTableEntry<int,_int>_*,_HighsHashTable<int,_int>::OpNewDeleter>
       .super__Head_base<0UL,_HighsHashTableEntry<int,_int>_*,_false>._M_head_impl;
  (this->entries)._M_t.
  super___uniq_ptr_impl<HighsHashTableEntry<int,_int>,_HighsHashTable<int,_int>::OpNewDeleter>._M_t.
  super__Tuple_impl<0UL,_HighsHashTableEntry<int,_int>_*,_HighsHashTable<int,_int>::OpNewDeleter>.
  super__Head_base<0UL,_HighsHashTableEntry<int,_int>_*,_false>._M_head_impl = _Var1._M_head_impl;
  if (_Var2._M_head_impl != (HighsHashTableEntry<int,_int> *)0x0) {
    operator_delete(_Var2._M_head_impl);
  }
  puVar3 = (param_1->metadata)._M_t.
           super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
           super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
           super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
  (param_1->metadata)._M_t.
  super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
  super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl = (uchar *)0x0;
  puVar4 = (this->metadata)._M_t.
           super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
           super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
           super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
  (this->metadata)._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
  _M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl = puVar3;
  if (puVar4 != (uchar *)0x0) {
    operator_delete__(puVar4);
  }
  this->numElements = param_1->numElements;
  uVar5 = param_1->numHashShift;
  this->tableSizeMask = param_1->tableSizeMask;
  this->numHashShift = uVar5;
  return this;
}

Assistant:

HighsHashTable<K, V>& operator=(HighsHashTable<K, V>&&) = default;